

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O3

void libyuv::ScalePlaneDown38_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  long lVar1;
  code *UNRECOVERED_JUMPTABLE;
  long lVar2;
  code *pcVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = CONCAT44(in_register_0000008c,dst_stride);
  lVar9 = CONCAT44(in_register_00000084,src_stride);
  iVar4 = 0;
  if ((int)src_ptr != 1) {
    iVar4 = dst_width;
  }
  if ((int)src_ptr == 0) {
    UNRECOVERED_JUMPTABLE = ScaleRowDown38_16_C;
    pcVar3 = ScaleRowDown38_16_C;
  }
  else {
    UNRECOVERED_JUMPTABLE = ScaleRowDown38_3_Box_16_C;
    pcVar3 = ScaleRowDown38_2_Box_16_C;
  }
  if (2 < src_height) {
    lVar2 = (long)iVar4;
    lVar5 = (long)(dst_width * 3);
    lVar1 = (long)dst_height * 2;
    iVar6 = 0;
    do {
      lVar7 = lVar8;
      (*UNRECOVERED_JUMPTABLE)(lVar9,lVar2,lVar7,src_width);
      (*UNRECOVERED_JUMPTABLE)(lVar9 + lVar5 * 2,lVar2,lVar7 + lVar1,src_width);
      lVar8 = lVar7 + lVar1 + lVar1;
      (*pcVar3)(lVar9 + lVar5 * 4,lVar2,lVar8,src_width);
      iVar6 = iVar6 + 3;
      lVar9 = lVar9 + (long)(dst_width * 2) * 2 + lVar5 * 4;
      lVar8 = lVar8 + lVar1;
    } while (iVar6 < src_height + -2);
    lVar8 = lVar7 + (long)dst_height * 6;
  }
  if (src_height % 3 != 1) {
    if (src_height % 3 != 2) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(lVar9,(long)iVar4,lVar8,src_width);
    lVar9 = lVar9 + (long)(dst_width * 3) * 2;
    lVar8 = lVar8 + (long)dst_height * 2;
  }
  (*UNRECOVERED_JUMPTABLE)(lVar9,0,lVar8,src_width);
  return;
}

Assistant:

static void ScalePlaneDown38_16(int src_width,
                                int src_height,
                                int dst_width,
                                int dst_height,
                                int src_stride,
                                int dst_stride,
                                const uint16_t* src_ptr,
                                uint16_t* dst_ptr,
                                enum FilterMode filtering) {
  int y;
  void (*ScaleRowDown38_3)(const uint16_t* src_ptr, ptrdiff_t src_stride,
                           uint16_t* dst_ptr, int dst_width);
  void (*ScaleRowDown38_2)(const uint16_t* src_ptr, ptrdiff_t src_stride,
                           uint16_t* dst_ptr, int dst_width);
  const int filter_stride = (filtering == kFilterLinear) ? 0 : src_stride;
  (void)src_width;
  (void)src_height;
  assert(dst_width % 3 == 0);
  if (!filtering) {
    ScaleRowDown38_3 = ScaleRowDown38_16_C;
    ScaleRowDown38_2 = ScaleRowDown38_16_C;
  } else {
    ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_C;
    ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_C;
  }
#if defined(HAS_SCALEROWDOWN38_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && (dst_width % 12 == 0)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_16_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_16_NEON;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_NEON;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_NEON;
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN38_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && (dst_width % 24 == 0)) {
    if (!filtering) {
      ScaleRowDown38_3 = ScaleRowDown38_16_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_16_SSSE3;
    } else {
      ScaleRowDown38_3 = ScaleRowDown38_3_Box_16_SSSE3;
      ScaleRowDown38_2 = ScaleRowDown38_2_Box_16_SSSE3;
    }
  }
#endif

  for (y = 0; y < dst_height - 2; y += 3) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_2(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 2;
    dst_ptr += dst_stride;
  }

  // Remainder 1 or 2 rows with last row vertically unfiltered
  if ((dst_height % 3) == 2) {
    ScaleRowDown38_3(src_ptr, filter_stride, dst_ptr, dst_width);
    src_ptr += src_stride * 3;
    dst_ptr += dst_stride;
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  } else if ((dst_height % 3) == 1) {
    ScaleRowDown38_3(src_ptr, 0, dst_ptr, dst_width);
  }
}